

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool __thiscall cmCTestTestHandler::GenerateXML(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  char *local_418 [4];
  cmXMLWriter xml;
  cmGeneratedFileStream xmlfile;
  
  bVar2 = cmCTest::GetProduceXML((this->super_cmCTestGenericHandler).CTest);
  if (bVar2) {
    cmGeneratedFileStream::cmGeneratedFileStream(&xmlfile,None);
    pcVar4 = "Test";
    if (this->MemCheck != false) {
      pcVar4 = "DynamicAnalysis";
    }
    bVar2 = cmCTestGenericHandler::StartResultingXML
                      (&this->super_cmCTestGenericHandler,(uint)this->MemCheck * 2 + PartTest,pcVar4
                       ,&xmlfile);
    if (bVar2) {
      cmXMLWriter::cmXMLWriter(&xml,(ostream *)&xmlfile,0);
      (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[9])(this);
      cmXMLWriter::~cmXMLWriter(&xml);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&xml);
      poVar3 = std::operator<<((ostream *)&xml,"Cannot create ");
      pcVar4 = "testing";
      if (this->MemCheck != false) {
        pcVar4 = "memory check";
      }
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3," XML file");
      std::endl<char,std::char_traits<char>>(poVar3);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x2d7,local_418[0],false);
      std::__cxx11::string::~string((string *)local_418);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xml);
      this->LogFile = (ostream *)0x0;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&xmlfile);
    if (bVar2) goto LAB_001da841;
LAB_001da92a:
    bVar2 = false;
  }
  else {
LAB_001da841:
    if (this->MemCheck == true) {
      cmGeneratedFileStream::cmGeneratedFileStream(&xmlfile,None);
      bVar2 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartTest,"DynamicAnalysis-Test",&xmlfile
                        );
      if (bVar2) {
        cmXMLWriter::cmXMLWriter(&xml,(ostream *)&xmlfile,0);
        GenerateCTestXML(this,&xml);
        cmXMLWriter::~cmXMLWriter(&xml);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&xml);
        poVar3 = std::operator<<((ostream *)&xml,"Cannot create testing XML file");
        std::endl<char,std::char_traits<char>>(poVar3);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x2e4,local_418[0],false);
        std::__cxx11::string::~string((string *)local_418);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xml);
        this->LogFile = (ostream *)0x0;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream(&xmlfile);
      if (!bVar2) goto LAB_001da92a;
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool cmCTestTestHandler::GenerateXML()
{
  if (this->CTest->GetProduceXML()) {
    cmGeneratedFileStream xmlfile;
    if (!this->StartResultingXML(
          (this->MemCheck ? cmCTest::PartMemCheck : cmCTest::PartTest),
          (this->MemCheck ? "DynamicAnalysis" : "Test"), xmlfile)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot create "
                   << (this->MemCheck ? "memory check" : "testing")
                   << " XML file" << std::endl);
      this->LogFile = nullptr;
      return false;
    }
    cmXMLWriter xml(xmlfile);
    this->GenerateCTestXML(xml);
  }

  if (this->MemCheck) {
    cmGeneratedFileStream xmlfile;
    if (!this->StartResultingXML(cmCTest::PartTest, "DynamicAnalysis-Test",
                                 xmlfile)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot create testing XML file" << std::endl);
      this->LogFile = nullptr;
      return false;
    }
    cmXMLWriter xml(xmlfile);
    // Explicitly call this class' `GenerateCTestXML` method to make `Test.xml`
    // as well.
    this->cmCTestTestHandler::GenerateCTestXML(xml);
  }

  return true;
}